

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::LimitingInputStream::ReadCord(LimitingInputStream *this,Cord *cord,int count)

{
  uint uVar1;
  int count_local;
  Cord *cord_local;
  LimitingInputStream *this_local;
  
  if (count < 1) {
    this_local._7_1_ = true;
  }
  else if (this->limit_ < (long)count) {
    (*this->input_->_vptr_ZeroCopyInputStream[6])(this->input_,cord,this->limit_ & 0xffffffff);
    this->limit_ = 0;
    this_local._7_1_ = false;
  }
  else {
    uVar1 = (*this->input_->_vptr_ZeroCopyInputStream[6])(this->input_,cord,(ulong)(uint)count);
    if ((uVar1 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      this->limit_ = this->limit_ - (long)count;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool LimitingInputStream::ReadCord(absl::Cord* cord, int count) {
  if (count <= 0) return true;
  if (count <= limit_) {
    if (!input_->ReadCord(cord, count)) return false;
    limit_ -= count;
    return true;
  }
  input_->ReadCord(cord, limit_);
  limit_ = 0;
  return false;
}